

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tuple.h
# Opt level: O2

int __thiscall
wasm::analysis::Tuple<wasm::analysis::Bool,wasm::analysis::Integer<unsigned_int>>::joinImpl<0ul,1ul>
          (undefined8 param_1,uint *joinee,uint *joiner)

{
  uint uVar1;
  uint uVar2;
  byte bVar3;
  
  bVar3 = (byte)joiner[1] ^ 1 | (byte)joinee[1];
  if (bVar3 == 0) {
    *(byte *)(joinee + 1) = (byte)joiner[1];
  }
  uVar1 = *joiner;
  uVar2 = *joinee;
  if (uVar2 < uVar1) {
    *joinee = uVar1;
  }
  return (int)(byte)(bVar3 ^ 1 | uVar2 < uVar1);
}

Assistant:

int joinImpl(Element& joinee,
               const Element& joiner,
               std::index_sequence<I, Is...>) const noexcept {
    // Recursive case: join the current element and recurse to the next
    // elements.
    return std::get<I>(lattices).join(std::get<I>(joinee),
                                      std::get<I>(joiner)) |
           joinImpl(joinee, joiner, std::index_sequence<Is...>{});
  }